

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O3

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this)

{
  pointer pcVar1;
  
  free((this->m_glu).xusub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).usub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).ucol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).xlsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).xlusup.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).lusup.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).supno.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_glu).xsup.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->m_etree).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free((this->m_perm_r).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free((this->m_perm_c).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free((this->m_mat).m_outerIndex);
  free((this->m_mat).m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&(this->m_mat).m_data);
  pcVar1 = (this->m_lastError)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_lastError).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~SparseLU()
    {
      // Free all explicit dynamic pointers 
    }